

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O0

void __thiscall
slang::ast::StructBuilder::addField
          (StructBuilder *this,string_view name,Type *fieldType,
          bitmask<slang::ast::VariableFlags> flags)

{
  FieldSymbol *this_00;
  uint64_t uVar1;
  Type *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  SourceLocation *in_RSI;
  Type *in_RDI;
  underlying_type in_R8W;
  BumpAllocator *unaff_retaddr;
  FieldSymbol *field;
  undefined6 in_stack_ffffffffffffffe8;
  
  this_00 = BumpAllocator::
            emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,unsigned_long&,unsigned_int&>
                      (unaff_retaddr,in_RDX,in_RSI,
                       (unsigned_long *)CONCAT26(in_R8W,in_stack_ffffffffffffffe8),(uint *)in_RDI);
  (this_00->super_VariableSymbol).flags.m_bits = in_R8W;
  ValueSymbol::setType((ValueSymbol *)this_00,in_RDI);
  Scope::addMember((Scope *)this_00,&in_RDI->super_Symbol);
  *(int *)&(in_RDI->super_Symbol).location = *(int *)&(in_RDI->super_Symbol).location + 1;
  uVar1 = Type::getSelectableWidth(in_RCX);
  (in_RDI->super_Symbol).name._M_str = (in_RDI->super_Symbol).name._M_str + uVar1;
  *(char **)((in_RDI->super_Symbol).name._M_len + 0x90) = (in_RDI->super_Symbol).name._M_str;
  return;
}

Assistant:

void StructBuilder::addField(std::string_view name, const Type& fieldType,
                             bitmask<VariableFlags> flags) {
    auto field = compilation.emplace<FieldSymbol>(name, NL, currBitOffset, currFieldIndex);
    field->flags = flags;
    field->setType(fieldType);
    type.addMember(*field);

    currFieldIndex++;
    currBitOffset += fieldType.getSelectableWidth();
    type.selectableWidth = currBitOffset;
}